

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

PageSegmentBase<Memory::VirtualAllocWrapper> * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::AddPageSegment(PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                 *this,DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>
                       *segmentList)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  PageSegmentBase<Memory::VirtualAllocWrapper> *pPVar6;
  
  iVar4 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar4 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x365,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pPVar6 = AllocPageSegment(segmentList,this,true,false,this->enableWriteBarrier);
  if (pPVar6 != (PageSegmentBase<Memory::VirtualAllocWrapper> *)0x0) {
    LogAllocSegment(this,1,(pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).segmentPageCount
                   );
    uVar1 = this->maxAllocPageCount;
    UpdateMinFreePageCount(this);
    this->freePageCount = this->freePageCount + (ulong)uVar1;
  }
  return pPVar6;
}

Assistant:

TPageSegment *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::AddPageSegment(DListBase<TPageSegment>& segmentList)
{
    Assert(!this->HasMultiThreadAccess());

    TPageSegment * segment = AllocPageSegment(segmentList, this, true, false, this->enableWriteBarrier);

    if (segment != nullptr)
    {
        this->LogAllocSegment(segment);
        this->AddFreePageCount(this->maxAllocPageCount);
    }
    return segment;
}